

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O2

int h262_motion_vectors(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,
                       h262_macroblock *mb,int s)

{
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint32_t *val;
  uint32_t (*paauVar9) [2] [2];
  long lVar10;
  
  if (picparm->picture_structure == 3) {
    uVar1 = mb->frame_motion_type;
    if (uVar1 == 1) {
LAB_00102f52:
      uVar6 = 2;
LAB_00102f55:
      bVar3 = true;
      bVar4 = false;
      goto LAB_00102f5d;
    }
    if (uVar1 != 3) {
      if (uVar1 != 2) {
LAB_00102f3c:
        abort();
      }
      bVar4 = true;
      uVar6 = 1;
      bVar3 = true;
      goto LAB_00102f5d;
    }
  }
  else {
    uVar2 = mb->field_motion_type;
    uVar6 = (ulong)uVar2;
    if (uVar6 == 1) goto LAB_00102f55;
    if (uVar2 != 3) {
      if (uVar2 != 2) goto LAB_00102f3c;
      goto LAB_00102f52;
    }
  }
  bVar4 = true;
  uVar6 = 1;
  bVar3 = false;
LAB_00102f5d:
  lVar7 = (long)s;
  paauVar9 = (uint32_t (*) [2] [2])(mb->motion_vertical_field_select + lVar7 + -5);
  uVar8 = 0;
  do {
    if (uVar8 == 2) {
      return 0;
    }
    if (uVar8 < uVar6) {
      if ((!bVar4) &&
         (iVar5 = vs_u(str,mb->motion_vertical_field_select[uVar8] + lVar7,1), iVar5 != 0)) {
        return 1;
      }
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 4) {
        iVar5 = vs_vlc(str,(uint32_t *)((long)paauVar9[3][1] + lVar10),motion_code_vlc);
        if (iVar5 != 0) {
          return 1;
        }
        val = (uint32_t *)((long)(paauVar9 + 5) + lVar10 + 8);
        if (*(int *)((long)paauVar9[3][1] + lVar10) == 0) {
          iVar5 = vs_infer(str,val,0);
        }
        else {
          iVar5 = vs_u(str,val,*(int *)((long)picparm->f_code[lVar7] + lVar10) + -1);
        }
        if (iVar5 != 0) {
          return 1;
        }
        if ((!bVar3) &&
           (iVar5 = vs_vlc(str,(uint32_t *)((long)mb->dmvector + lVar10),dmvector_vlc), iVar5 != 0))
        {
          return 1;
        }
      }
    }
    else {
      iVar5 = vs_infer(str,mb->motion_code[1][lVar7],0);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = vs_infer(str,mb->motion_residual[-1][lVar7] + 1,0);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = vs_infer(str,mb->motion_residual[1][lVar7],0);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = vs_infer(str,mb->dmvector + lVar7 * 2 + -3,0);
      if (iVar5 != 0) {
        return 1;
      }
    }
    uVar8 = uVar8 + 1;
    paauVar9 = paauVar9 + 1;
  } while( true );
}

Assistant:

int h262_motion_vectors(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int s) {
	int mvc, mfs, dmv;
	if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
		switch (mb->frame_motion_type) {
			case H262_FRAME_MOTION_FIELD:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_FRAME:
				mvc = 1;
				mfs = 0;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	} else {
		switch (mb->field_motion_type) {
			case H262_FIELD_MOTION_FIELD:
				mvc = 1;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_16X8:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	}
	int r, t;
	for (r = 0; r < 2; r++) {
		if (r < mvc) {
			if (mfs)
				if (vs_u(str, &mb->motion_vertical_field_select[r][s], 1)) return 1;
			for (t = 0; t < 2; t++) {
				if (vs_vlc(str, &mb->motion_code[r][s][t], motion_code_vlc)) return 1;
				if (mb->motion_code[r][s][t]) {
					if (vs_u(str, &mb->motion_residual[r][s][t], picparm->f_code[s][t]-1)) return 1;
				} else {
					if (vs_infer(str, &mb->motion_residual[r][s][t], 0)) return 1;
				}
				if (dmv) {
					if (vs_vlc(str, &mb->dmvector[t], dmvector_vlc)) return 1;
				}
			}
		} else {
			if (vs_infer(str, &mb->motion_code[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_code[r][s][1], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][1], 0)) return 1;
		}
	}
	return 0;
}